

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_readNCount_bmi2(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,
                          void *headerBuffer,size_t hbSize,int bmi2)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint *puVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  bool bVar18;
  size_t sStack_50;
  undefined8 local_38;
  
  if (bmi2 != 0) {
    sVar4 = FSE_readNCount_body_bmi2(normalizedCounter,maxSVPtr,tableLogPtr,headerBuffer,hbSize);
    return sVar4;
  }
  if (hbSize < 8) {
    local_38 = 0;
    memcpy(&local_38,headerBuffer,hbSize);
    sVar4 = FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,&local_38,8);
    sStack_50 = 0xffffffffffffffec;
    if (sVar4 <= hbSize) {
      sStack_50 = sVar4;
    }
    if (0xffffffffffffff88 < sVar4) {
      sStack_50 = sVar4;
    }
  }
  else {
    uVar7 = *maxSVPtr + 1;
    memset(normalizedCounter,0,(ulong)uVar7 * 2);
    uVar2 = *headerBuffer & 0xf;
    if (uVar2 < 0xb) {
      uVar14 = *headerBuffer >> 4;
      *tableLogPtr = uVar2 + 5;
      iVar12 = 0x20 << (sbyte)uVar2;
      uVar10 = iVar12 + 1;
      iVar3 = uVar2 + 6;
      puVar1 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar17 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar18 = true;
      uVar2 = 4;
      uVar16 = 0;
      puVar11 = (uint *)headerBuffer;
      do {
        uVar8 = uVar16;
        if (!bVar18) {
          while( true ) {
            uVar5 = 0;
            if ((~uVar14 | 0x80000000) != 0) {
              for (; ((~uVar14 | 0x80000000) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            if (uVar5 < 0x18) break;
            if (puVar1 < puVar11) {
              uVar2 = uVar2 + ((int)puVar11 - (int)puVar1) * 8 & 0x1f;
              puVar11 = puVar17;
            }
            else {
              puVar11 = (uint *)((long)puVar11 + 3);
            }
            uVar14 = *puVar11 >> (sbyte)uVar2;
            uVar8 = uVar8 + 0x24;
          }
          uVar15 = uVar14 >> ((byte)(uVar5 & 0xfffffffe) & 0x1f) & 3;
          uVar16 = (uVar5 >> 1) * 3 + uVar8 + uVar15;
          uVar14 = uVar2 + (uVar5 & 0xfffffffe) + 2;
          if (uVar7 <= uVar16) {
            uVar16 = uVar15 + (uVar5 >> 1) * 3 + uVar8;
LAB_0013948f:
            if (uVar10 != 1) {
              return 0xffffffffffffffec;
            }
            if (uVar7 < uVar16) {
              return 0xffffffffffffffd0;
            }
            if (0x20 < (int)uVar14) {
              return 0xffffffffffffffec;
            }
            *maxSVPtr = uVar16 - 1;
            return (long)puVar11 + ((long)((int)(uVar14 + 7) >> 3) - (long)headerBuffer);
          }
          if ((puVar1 < puVar11) && (puVar17 < (uint *)((long)puVar11 + (ulong)(uVar14 >> 3)))) {
            uVar2 = uVar14 + ((int)puVar11 - (int)puVar17) * 8 & 0x1f;
            puVar11 = puVar17;
          }
          else {
            uVar2 = uVar14 & 7;
            puVar11 = (uint *)((long)puVar11 + (ulong)(uVar14 >> 3));
          }
          uVar14 = *puVar11 >> (sbyte)uVar2;
        }
        uVar8 = iVar12 * 2 - 1;
        uVar15 = uVar8 - uVar10;
        uVar5 = iVar12 - 1U & uVar14;
        if (uVar5 < uVar15) {
          iVar9 = iVar3 + -1;
        }
        else {
          uVar14 = uVar14 & uVar8;
          if ((int)uVar14 < iVar12) {
            uVar15 = 0;
          }
          uVar5 = uVar14 - uVar15;
          iVar9 = iVar3;
        }
        uVar14 = iVar9 + uVar2;
        iVar9 = uVar5 - 1;
        iVar13 = 1 - uVar5;
        if ((int)uVar5 < 1) {
          iVar13 = iVar9;
        }
        uVar10 = uVar10 + iVar13;
        uVar6 = (ulong)uVar16;
        uVar16 = uVar16 + 1;
        normalizedCounter[uVar6] = (short)iVar9;
        bVar18 = iVar9 != 0;
        if ((int)uVar10 < iVar12) {
          if ((int)uVar10 < 2) goto LAB_0013948f;
          uVar2 = 0x1f;
          if (uVar10 != 0) {
            for (; uVar10 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          iVar3 = (uVar2 ^ 0xffffffe0) + 0x21;
          iVar12 = 1 << ((byte)uVar2 & 0x1f);
        }
        if (uVar7 <= uVar16) goto LAB_0013948f;
        if ((puVar1 < puVar11) && (puVar17 < (uint *)((long)puVar11 + (long)((int)uVar14 >> 3)))) {
          uVar2 = uVar14 + ((int)puVar11 - (int)puVar17) * 8 & 0x1f;
          puVar11 = puVar17;
        }
        else {
          uVar2 = uVar14 & 7;
          puVar11 = (uint *)((long)puVar11 + (long)((int)uVar14 >> 3));
        }
        uVar14 = *puVar11 >> (sbyte)uVar2;
      } while( true );
    }
    sStack_50 = 0xffffffffffffffd4;
  }
  return sStack_50;
}

Assistant:

size_t FSE_readNCount_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_readNCount_body_bmi2(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
    }
#endif
    (void)bmi2;
    return FSE_readNCount_body_default(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}